

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::clear(dxt_hc *this)

{
  uint local_14;
  uint c;
  dxt_hc *this_local;
  
  this->m_blocks = (color_quad_u8 (*) [16])0x0;
  this->m_num_blocks = 0;
  this->m_num_alpha_blocks = 0;
  this->m_has_color_blocks = false;
  vector<crnlib::dxt_hc::color_cluster>::clear(&this->m_color_clusters);
  vector<crnlib::dxt_hc::alpha_cluster>::clear(&this->m_alpha_clusters);
  this->m_canceled = false;
  this->m_prev_phase_index = -1;
  this->m_prev_percentage_complete = -1;
  vector<float>::clear(&this->m_block_weights);
  vector<unsigned_char>::clear(&this->m_block_encodings);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    vector<unsigned_long_long>::clear(this->m_block_selectors + local_14);
  }
  vector<unsigned_int>::clear(&this->m_color_selectors);
  vector<unsigned_long_long>::clear(&this->m_alpha_selectors);
  vector<bool>::clear(&this->m_color_selectors_used);
  vector<bool>::clear(&this->m_alpha_selectors_used);
  vector<unsigned_int>::clear(&this->m_tile_indices);
  vector<crnlib::dxt_hc::endpoint_indices_details>::clear(&this->m_endpoint_indices);
  vector<crnlib::dxt_hc::selector_indices_details>::clear(&this->m_selector_indices);
  vector<crnlib::dxt_hc::tile_details>::clear(&this->m_tiles);
  this->m_num_tiles = 0;
  return;
}

Assistant:

void dxt_hc::clear()
    {
        m_blocks = 0;
        m_num_blocks = 0;
        m_num_alpha_blocks = 0;
        m_has_color_blocks = false;

        m_color_clusters.clear();
        m_alpha_clusters.clear();

        m_canceled = false;

        m_prev_phase_index = -1;
        m_prev_percentage_complete = -1;

        m_block_weights.clear();
        m_block_encodings.clear();
        for (uint c = 0; c < 3; c++)
        {
            m_block_selectors[c].clear();
        }
        m_color_selectors.clear();
        m_alpha_selectors.clear();
        m_color_selectors_used.clear();
        m_alpha_selectors_used.clear();
        m_tile_indices.clear();
        m_endpoint_indices.clear();
        m_selector_indices.clear();
        m_tiles.clear();
        m_num_tiles = 0;
    }